

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionExpression.cpp
# Opt level: O2

void slang::ast::ConversionExpression::checkImplicitConversions
               (ASTContext *context,Type *sourceType,Type *targetType,Expression *op,
               Expression *parentExpr,SourceRange operatorRange,ConversionKind conversionKind)

{
  SymbolKind SVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  EffectiveSign EVar6;
  bitwidth_t bVar7;
  bitwidth_t bVar8;
  Expression *pEVar9;
  Type *this;
  Type *this_00;
  ConstantRange CVar10;
  ConstantRange CVar11;
  Type *this_01;
  Type *this_02;
  Diagnostic *pDVar12;
  optional<unsigned_int> oVar13;
  InstanceSymbolBase *pIVar14;
  int iVar15;
  uint uVar16;
  DiagCode code;
  Type *t;
  int iVar17;
  anon_class_8_1_8edc1b7d parentIsComparison;
  anon_class_24_3_d0f3c930 addDiag;
  anon_class_8_1_8edc1b7d local_80;
  anon_class_24_3_d0f3c930 local_78;
  Expression *local_60;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_58;
  
  local_80.parentExpr = &local_60;
  local_78.operatorRange = &operatorRange;
  t = sourceType;
  local_78.context = context;
  local_78.op = op;
  local_60 = parentExpr;
  pEVar9 = Expression::unwrapImplicitConversions(op);
  if (pEVar9->kind == LValueReference) {
    return;
  }
  if ((pEVar9->kind == BinaryOp) &&
     (pEVar9 = Expression::unwrapImplicitConversions(*(Expression **)(pEVar9 + 1)),
     pEVar9->kind == LValueReference)) {
    return;
  }
  this = Type::getCanonicalType(targetType);
  this_00 = Type::getCanonicalType(sourceType);
  bVar3 = Type::isIntegral(this);
  if ((bVar3) && (bVar3 = Type::isIntegral(this_00), bVar3)) {
    SVar1 = (this->super_Symbol).kind;
    if ((((PackedUnionType < SVar1) || ((0x140400U >> (SVar1 & UntypedType) & 1) == 0)) ||
        (SVar1 = (this_00->super_Symbol).kind, PackedUnionType < SVar1)) ||
       (((0x140400U >> (SVar1 & UntypedType) & 1) == 0 ||
        (t = this_00, bVar3 = Type::isMatching(this,this_00), bVar3)))) {
      bVar3 = checkImplicitConversions::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)this,t);
      if ((bVar3) &&
         (bVar3 = checkImplicitConversions::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)this_00,t), this_02 = this_00,
         this_01 = this, bVar3)) {
        do {
          CVar10 = Type::getFixedRange(this_01);
          CVar11 = Type::getFixedRange(this_02);
          iVar5 = CVar11.left;
          iVar15 = CVar11.right;
          iVar2 = iVar5 - iVar15;
          if (iVar5 - iVar15 == 0 || iVar5 < iVar15) {
            iVar2 = -(iVar5 - iVar15);
          }
          iVar17 = CVar10.left;
          iVar15 = CVar10.right;
          iVar5 = iVar17 - iVar15;
          if (iVar17 - iVar15 == 0 || iVar17 < iVar15) {
            iVar5 = -(iVar17 - iVar15);
          }
          if (iVar5 != iVar2) goto LAB_0043ec00;
          this_01 = Type::getArrayElementType(this_01);
          this_02 = Type::getArrayElementType(this_02);
        } while ((this_01 != (Type *)0x0) && (this_02 != (Type *)0x0));
        if ((this_01 != (Type *)0x0) != (this_02 != (Type *)0x0)) {
LAB_0043ec00:
          bVar3 = checkImplicitConversions::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)op,(Expression *)t);
          if ((!bVar3) &&
             ((bVar3 = checkImplicitConversions::anon_class_8_1_8edc1b7d::operator()(&local_80),
              !bVar3 || (bVar3 = checkImplicitConversions::anon_class_1_0_00000001::operator()
                                           ((anon_class_1_0_00000001 *)local_60[1].type.ptr,
                                            (Expression *)t), !bVar3)))) {
            pDVar12 = checkImplicitConversions::anon_class_24_3_d0f3c930::operator()
                                (&local_78,(DiagCode)0xcd0007);
            pDVar12 = ast::operator<<(pDVar12,sourceType);
            ast::operator<<(pDVar12,targetType);
          }
        }
      }
      ASTContext::tryEval((ConstantValue *)&local_58,context,op);
      std::__detail::__variant::
      _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
      ::~_Variant_storage(&local_58);
      if (local_58._M_index != '\0') {
        return;
      }
      bVar3 = Type::isSigned(this);
      bVar4 = Type::isSigned(this_00);
      if (((bVar3 != bVar4) &&
          (bVar3 = checkImplicitConversions::anon_class_8_1_8edc1b7d::operator()(&local_80), !bVar3)
          ) && (EVar6 = Expression::getEffectiveSign(op,false), EVar6 != Either)) {
        pDVar12 = checkImplicitConversions::anon_class_24_3_d0f3c930::operator()
                            (&local_78,(DiagCode)0xd40007);
        pDVar12 = ast::operator<<(pDVar12,sourceType);
        ast::operator<<(pDVar12,targetType);
      }
      if (conversionKind == Propagated) {
        return;
      }
      bVar7 = Type::getBitWidth(this);
      bVar8 = Type::getBitWidth(this_00);
      if (bVar7 == bVar8) {
        return;
      }
      oVar13 = Expression::getEffectiveWidth(op);
      if (((ulong)oVar13.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_int> >> 0x20 & 1) == 0) {
        return;
      }
      if (bVar7 <= bVar8 &&
          oVar13.super__Optional_base<unsigned_int,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_int>._M_payload <= bVar7) {
        return;
      }
      pIVar14 = ASTContext::getInstance(context);
      uVar16 = 0xce0007;
      if (pIVar14 == (InstanceSymbolBase *)0x0) {
        uVar16 = 0xda0007;
      }
      pDVar12 = checkImplicitConversions::anon_class_24_3_d0f3c930::operator()
                          (&local_78,
                           (DiagCode)
                           (uVar16 | (uint)(bVar7 < oVar13.
                                                  super__Optional_base<unsigned_int,_true,_true>.
                                                  _M_payload.
                                                  super__Optional_payload_base<unsigned_int>.
                                                  _M_payload) << 0x10));
      pDVar12 = Diagnostic::operator<<<unsigned_int>(pDVar12,bVar8);
      Diagnostic::operator<<<unsigned_int>(pDVar12,bVar7);
      return;
    }
    bVar3 = anon_unknown.dwarf_1b2edd5::isSameStructUnion(this,this_00);
    if (bVar3) {
      return;
    }
    bVar3 = anon_unknown.dwarf_1b2edd5::isUnionMemberType(this,this_00);
    if (bVar3) {
      return;
    }
    code.subsystem = Expressions;
    code.code = 0xc3;
  }
  else {
    bVar3 = Type::isNumeric(this);
    if (!bVar3) {
      return;
    }
    bVar3 = Type::isNumeric(this_00);
    if (!bVar3) {
      return;
    }
    ASTContext::tryEval((ConstantValue *)&local_58,context,op);
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
    ::~_Variant_storage(&local_58);
    if (local_58._M_index != '\0') {
      return;
    }
    bVar3 = Type::isIntegral(this);
    code.subsystem = Expressions;
    code.code = 0xbf;
    if (!bVar3) {
      bVar3 = Type::isIntegral(this_00);
      code.subsystem = Expressions;
      code.code = 199;
      if (!bVar3) {
        bVar7 = Type::getBitWidth(this);
        bVar8 = Type::getBitWidth(this_00);
        code.subsystem = Expressions;
        code.code = 0xc0;
        if (bVar8 <= bVar7) {
          bVar7 = Type::getBitWidth(this);
          bVar8 = Type::getBitWidth(this_00);
          code.subsystem = Expressions;
          code.code = 0xc1;
          if (bVar7 <= bVar8) {
            return;
          }
        }
      }
    }
  }
  pDVar12 = checkImplicitConversions::anon_class_24_3_d0f3c930::operator()(&local_78,code);
  pDVar12 = ast::operator<<(pDVar12,sourceType);
  ast::operator<<(pDVar12,targetType);
  return;
}

Assistant:

void ConversionExpression::checkImplicitConversions(
    const ASTContext& context, const Type& sourceType, const Type& targetType, const Expression& op,
    const Expression* parentExpr, SourceRange operatorRange, ConversionKind conversionKind) {

    auto isStructUnionEnum = [](const Type& t) {
        return t.kind == SymbolKind::PackedStructType || t.kind == SymbolKind::PackedUnionType ||
               t.kind == SymbolKind::EnumType;
    };

    auto isMultiDimArray = [](const Type& t) {
        return t.kind == SymbolKind::PackedArrayType && t.getArrayElementType()->getBitWidth() > 1;
    };

    auto parentIsComparison = [&] {
        return parentExpr && parentExpr->kind == ExpressionKind::BinaryOp &&
               OpInfo::isComparison(parentExpr->as<BinaryExpression>().op);
    };

    auto addDiag = [&](DiagCode code) -> Diagnostic& {
        auto& diag = context.addDiag(code, op.sourceRange);
        if (operatorRange.start())
            diag << operatorRange;
        return diag;
    };

    // Don't warn about conversions in compound assignment operators.
    auto isCompoundAssign = [&] {
        auto& expr = op.unwrapImplicitConversions();
        if (expr.kind == ExpressionKind::LValueReference)
            return true;

        return expr.kind == ExpressionKind::BinaryOp &&
               expr.as<BinaryExpression>().left().unwrapImplicitConversions().kind ==
                   ExpressionKind::LValueReference;
    };
    if (isCompoundAssign())
        return;

    const Type& lt = targetType.getCanonicalType();
    const Type& rt = sourceType.getCanonicalType();
    if (lt.isIntegral() && rt.isIntegral()) {
        // Warn for conversions between different enums/structs/unions.
        if (isStructUnionEnum(lt) && isStructUnionEnum(rt) && !lt.isMatching(rt)) {
            if (!isSameStructUnion(lt, rt) && !isUnionMemberType(lt, rt))
                addDiag(diag::ImplicitConvert) << sourceType << targetType;
            return;
        }

        // Warn for conversions between packed arrays of differing
        // dimension counts or sizes.
        if (isMultiDimArray(lt) && isMultiDimArray(rt) && !hasSameDims(lt, rt)) {
            // Avoid warning for assignments or comparisons with 0 or '0, '1.
            auto isZeroOrUnsized = [](const Expression& e) {
                auto expr = &e.unwrapImplicitConversions();
                if (expr->kind == ExpressionKind::ConditionalOp) {
                    if (auto known = expr->as<ConditionalExpression>().knownSide())
                        expr = known;
                }

                return expr->kind == ExpressionKind::UnbasedUnsizedIntegerLiteral ||
                       (expr->kind == ExpressionKind::IntegerLiteral &&
                        bool(expr->as<IntegerLiteral>().getValue() == 0));
            };

            if (!isZeroOrUnsized(op) &&
                (!parentIsComparison() ||
                 !isZeroOrUnsized(parentExpr->as<BinaryExpression>().right()))) {
                addDiag(diag::PackedArrayConv) << sourceType << targetType;
            }
        }

        // Check to rule out false positives: try to eval as a constant.
        // We'll ignore any constants, because they will get their own more
        // fine grained warning during eval.
        if (context.tryEval(op))
            return;

        // Warn for sign conversions.
        if (lt.isSigned() != rt.isSigned()) {
            // Comparisons get their own warning elsewhere.
            if (!parentIsComparison() && op.getEffectiveSign(/* isForConversion */ false) !=
                                             Expression::EffectiveSign::Either) {
                addDiag(diag::SignConversion) << sourceType << targetType;
            }
        }

        // Don't issue width warnings for propagated conversions, as they would
        // be extremely noisy and of dubious value (since they act the way people
        // expect their expressions to behave).
        if (conversionKind == ConversionKind::Propagated)
            return;

        // Warn for implicit assignments between integral types of differing widths.
        bitwidth_t targetWidth = lt.getBitWidth();
        bitwidth_t actualWidth = rt.getBitWidth();
        if (targetWidth == actualWidth)
            return;

        // Before we go and issue this warning, weed out false positives by
        // recomputing the width of the expression, with all constants sized
        // to the minimum width necessary to represent them. Otherwise, even
        // code as simple as this will result in a warning:
        //    logic [3:0] a = 1;
        std::optional<bitwidth_t> effective = op.getEffectiveWidth();
        if (!effective)
            return;

        // Now that we know the effective width, compare it to the expression's
        // actual width. We don't warn if the target is anywhere in between the
        // effective and the actual width.
        SLANG_ASSERT(effective <= actualWidth);
        if (targetWidth < effective || targetWidth > actualWidth) {
            DiagCode code;
            if (context.getInstance())
                code = targetWidth < effective ? diag::PortWidthTruncate : diag::PortWidthExpand;
            else
                code = targetWidth < effective ? diag::WidthTruncate : diag::WidthExpand;
            addDiag(code) << actualWidth << targetWidth;
        }
    }
    else if (lt.isNumeric() && rt.isNumeric()) {
        // Don't warn for constexprs.
        if (context.tryEval(op))
            return;

        DiagCode code;
        if (lt.isIntegral())
            code = diag::FloatIntConv;
        else if (rt.isIntegral())
            code = diag::IntFloatConv;
        else if (lt.getBitWidth() < rt.getBitWidth())
            code = diag::FloatNarrow;
        else if (lt.getBitWidth() > rt.getBitWidth())
            code = diag::FloatWiden;
        else
            return;

        addDiag(code) << sourceType << targetType;
    }
}